

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>,_true>
 duckdb::
 make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalArrowBatchCollector,duckdb::PreparedStatementData&,unsigned_long&>
           (PreparedStatementData *args,unsigned_long *args_1)

{
  PhysicalArrowBatchCollector *this;
  _Head_base<0UL,_duckdb::PhysicalResultCollector_*,_false> in_RDI;
  pointer in_stack_ffffffffffffffb8;
  _Head_base<0UL,_duckdb::PhysicalResultCollector_*,_false> data;
  
  data._M_head_impl = in_RDI._M_head_impl;
  this = (PhysicalArrowBatchCollector *)operator_new(0x138);
  PhysicalArrowBatchCollector::PhysicalArrowBatchCollector
            (this,(PreparedStatementData *)data._M_head_impl,(idx_t)in_RDI._M_head_impl);
  unique_ptr<duckdb::PhysicalResultCollector,std::default_delete<duckdb::PhysicalResultCollector>,true>
  ::unique_ptr<std::default_delete<duckdb::PhysicalResultCollector>,void>
            ((unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>,_true>
              *)in_RDI._M_head_impl,in_stack_ffffffffffffffb8);
  return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
          )(_Tuple_impl<0UL,_duckdb::PhysicalResultCollector_*,_std::default_delete<duckdb::PhysicalResultCollector>_>
            )data._M_head_impl;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}